

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::MILSpec::Value_ImmediateValue::SerializeWithCachedSizes
          (Value_ImmediateValue *this,CodedOutputStream *output)

{
  bool bVar1;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  Value_ImmediateValue *this_local;
  
  bVar1 = has_tensor(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (1,&((this->value_).tensor_)->super_MessageLite,output);
  }
  bVar1 = has_tuple(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (2,&((this->value_).tensor_)->super_MessageLite,output);
  }
  bVar1 = has_list(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (3,&((this->value_).tensor_)->super_MessageLite,output);
  }
  bVar1 = has_dictionary(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (4,&((this->value_).tensor_)->super_MessageLite,output);
  }
  return;
}

Assistant:

void Value_ImmediateValue::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.MILSpec.Value.ImmediateValue)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.MILSpec.TensorValue tensor = 1;
  if (has_tensor()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      1, *value_.tensor_, output);
  }

  // .CoreML.Specification.MILSpec.TupleValue tuple = 2;
  if (has_tuple()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      2, *value_.tuple_, output);
  }

  // .CoreML.Specification.MILSpec.ListValue list = 3;
  if (has_list()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      3, *value_.list_, output);
  }

  // .CoreML.Specification.MILSpec.DictionaryValue dictionary = 4;
  if (has_dictionary()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      4, *value_.dictionary_, output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.MILSpec.Value.ImmediateValue)
}